

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::FloorDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference input_00;
  undefined7 in_register_00000031;
  ulong uVar1;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000031,scale) << 4);
  local_28 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + uVar1);
  uStack_20 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + uVar1 + 8);
  input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  local_30 = &local_28;
  UnaryExecutor::
  ExecuteStandard<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::FloorDecimalOperator::Operation<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_>
            (input_00,result,input->count,&local_30,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				// below 0 we ceil the number (e.g. -10.5 -> -11)
				return UnsafeNumericCast<T>(((input + 1) / power_of_ten) - 1);
			} else {
				// above 0 we floor the number
				return UnsafeNumericCast<T>(input / power_of_ten);
			}
		});
	}